

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecialFormat.cpp
# Opt level: O2

TrackData * GenerateEmptyTrack(TrackData *__return_storage_ptr__,CylHead *cylhead,Track *track)

{
  bool bVar1;
  BitBuffer *bitstream;
  BitstreamTrackBuilder bitbuf;
  
  bVar1 = IsEmptyTrack(track);
  if (bVar1) {
    BitstreamTrackBuilder::BitstreamTrackBuilder(&bitbuf,_250K,MFM);
    TrackBuilder::addBlock(&bitbuf.super_TrackBuilder,0x4e,0x186a);
    bitstream = BitstreamTrackBuilder::buffer(&bitbuf);
    TrackData::TrackData(__return_storage_ptr__,cylhead,bitstream);
    BitBuffer::~BitBuffer(&bitbuf.m_buffer);
    return __return_storage_ptr__;
  }
  __assert_fail("IsEmptyTrack(track)",
                "/workspace/llm4binary/github/license_c_cmakelists/simonowen[P]samdisk/src/SpecialFormat.cpp"
                ,0x15,"TrackData GenerateEmptyTrack(const CylHead &, const Track &)");
}

Assistant:

TrackData GenerateEmptyTrack(const CylHead& cylhead, const Track& track)
{
    assert(IsEmptyTrack(track));
    (void)track;

    // Generate a DD track full of gap filler. It shouldn't really matter
    // which datarate and encoding as long as there are no sync marks.
    BitstreamTrackBuilder bitbuf(DataRate::_250K, Encoding::MFM);
    bitbuf.addBlock(0x4e, 6250);

    return TrackData(cylhead, std::move(bitbuf.buffer()));
}